

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O0

void __thiscall
gvr::ColoredMesh::resizeVertexList(ColoredMesh *this,int vn,bool with_scanprop,bool with_scanpos)

{
  void *pvVar1;
  byte bVar2;
  void *pvVar3;
  int *piVar4;
  byte in_CL;
  byte bVar5;
  byte in_DL;
  int in_ESI;
  PointCloud *in_RDI;
  ulong uVar6;
  int i_1;
  int i;
  uchar *p;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined2 in_stack_fffffffffffffff0;
  
  bVar5 = in_DL & 1;
  bVar2 = in_CL & 1;
  uVar6 = (ulong)(in_ESI * 3);
  if ((long)uVar6 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar6);
  local_20 = PointCloud::getVertexCount(in_RDI);
  piVar4 = std::min<int>(&local_20,(int *)&stack0xfffffffffffffff4);
  local_1c = *piVar4 * 3;
  while (local_1c = local_1c + -1, -1 < local_1c) {
    *(undefined1 *)((long)pvVar3 + (long)local_1c) =
         *(undefined1 *)((long)in_RDI[1].super_Model.origin.v[1] + (long)local_1c);
  }
  local_28 = PointCloud::getVertexCount(in_RDI);
  piVar4 = std::min<int>(&local_28,(int *)&stack0xfffffffffffffff4);
  for (local_24 = *piVar4 * 3; SBORROW4(local_24,in_ESI * 3) != local_24 + in_ESI * -3 < 0;
      local_24 = local_24 + 1) {
    *(undefined1 *)((long)pvVar3 + (long)local_24) = 0;
  }
  pvVar1 = (void *)in_RDI[1].super_Model.origin.v[1];
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  in_RDI[1].super_Model.origin.v[1] = (double)pvVar3;
  Mesh::resizeVertexList
            ((Mesh *)CONCAT44(in_ESI,CONCAT13(bVar5,CONCAT12(bVar2,in_stack_fffffffffffffff0))),
             (int)((ulong)pvVar3 >> 0x20),SUB81((ulong)pvVar3 >> 0x18,0),
             SUB81((ulong)pvVar3 >> 0x10,0));
  return;
}

Assistant:

void ColoredMesh::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  unsigned char *p=new unsigned char [3*vn];

  for (int i=3*std::min(getVertexCount(), vn)-1; i>=0; i--)
  {
    p[i]=rgb[i];
  }

  for (int i=3*std::min(getVertexCount(), vn); i<3*vn; i++)
  {
    p[i]=0;
  }

  delete [] rgb;

  rgb=p;

  Mesh::resizeVertexList(vn, with_scanprop, with_scanpos);
}